

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O0

bool __thiscall
Imath_3_2::FrustumTest<float>::completelyContains(FrustumTest<float> *this,Sphere3<float> *sphere)

{
  Vec3<float> *in_RSI;
  Vec3<float> *in_RDI;
  Vec3<float> d1;
  Vec3<float> d0;
  Vec3<float> radiusVec;
  Vec3<float> center;
  Vec3<float> *in_stack_ffffffffffffff28;
  float local_90;
  float local_8c;
  float local_88;
  float local_3c;
  float local_38;
  float local_34;
  Vec3<float> local_30;
  Vec3<float> local_24;
  Vec3<float> *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  Vec3<float>::Vec3(&local_24,in_RSI);
  Vec3<float>::Vec3(&local_30,local_18[1].x,local_18[1].x,local_18[1].x);
  Vec3<float>::operator*(in_stack_ffffffffffffff28,(float)((ulong)in_RDI >> 0x20));
  Vec3<float>::operator*(in_stack_ffffffffffffff28,(float)((ulong)in_RDI >> 0x20));
  Vec3<float>::operator+(in_stack_ffffffffffffff28,in_RDI);
  Vec3<float>::operator*(in_stack_ffffffffffffff28,(float)((ulong)in_RDI >> 0x20));
  Vec3<float>::operator+(in_stack_ffffffffffffff28,in_RDI);
  Vec3<float>::operator+(in_stack_ffffffffffffff28,in_RDI);
  Vec3<float>::operator-(in_stack_ffffffffffffff28,in_RDI);
  if (((0.0 <= local_3c) || (0.0 <= local_38)) || (0.0 <= local_34)) {
    local_1 = false;
  }
  else {
    Vec3<float>::operator*(in_stack_ffffffffffffff28,(float)((ulong)in_RDI >> 0x20));
    Vec3<float>::operator*(in_stack_ffffffffffffff28,(float)((ulong)in_RDI >> 0x20));
    Vec3<float>::operator+(in_stack_ffffffffffffff28,in_RDI);
    Vec3<float>::operator*(in_stack_ffffffffffffff28,(float)((ulong)in_RDI >> 0x20));
    Vec3<float>::operator+(in_stack_ffffffffffffff28,in_RDI);
    Vec3<float>::operator+(in_stack_ffffffffffffff28,in_RDI);
    Vec3<float>::operator-(in_stack_ffffffffffffff28,in_RDI);
    if (((0.0 <= local_90) || (0.0 <= local_8c)) || (0.0 <= local_88)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool
FrustumTest<T>::completelyContains (const Sphere3<T>& sphere) const
    IMATH_NOEXCEPT
{
    Vec3<T> center    = sphere.center;
    Vec3<T> radiusVec = Vec3<T> (sphere.radius, sphere.radius, sphere.radius);

    // This is a vertical dot-product on three vectors at once.
    Vec3<T> d0 = planeNormX[0] * center.x + planeNormY[0] * center.y +
                 planeNormZ[0] * center.z + radiusVec - planeOffsetVec[0];

    if (d0.x >= 0 || d0.y >= 0 || d0.z >= 0) return false;

    Vec3<T> d1 = planeNormX[1] * center.x + planeNormY[1] * center.y +
                 planeNormZ[1] * center.z + radiusVec - planeOffsetVec[1];

    if (d1.x >= 0 || d1.y >= 0 || d1.z >= 0) return false;

    return true;
}